

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

int lws_find_string_in_file(char *filename,char *string,int stringlen)

{
  char cVar1;
  int __fd;
  ssize_t sVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char buf [128];
  char local_a8 [128];
  
  iVar4 = 0;
  __fd = lws_open(filename,0);
  if (__fd < 0) {
    uVar5 = 0;
    _lws_log(1,"can\'t open auth file: %s\n",filename);
  }
  else {
    iVar3 = 0;
    sVar2 = 0;
    while( true ) {
      if (iVar3 == (int)sVar2) {
        sVar2 = read(__fd,local_a8,0x80);
        iVar3 = 0;
        if ((int)sVar2 < 1) {
          uVar5 = (uint)(iVar4 == stringlen);
          goto LAB_0011efa5;
        }
      }
      cVar1 = local_a8[iVar3];
      if ((iVar4 == stringlen) && ((cVar1 == '\n' || (iVar4 = 0, cVar1 == '\r')))) break;
      if (cVar1 == string[iVar4]) {
        iVar4 = iVar4 + 1;
      }
      else {
        iVar4 = 0;
      }
      iVar3 = iVar3 + 1;
    }
    uVar5 = 1;
LAB_0011efa5:
    close(__fd);
  }
  return uVar5;
}

Assistant:

static int
lws_find_string_in_file(const char *filename, const char *string, int stringlen)
{
	char buf[128];
	int fd, match = 0, pos = 0, n = 0, hit = 0;

	fd = lws_open(filename, O_RDONLY);
	if (fd < 0) {
		lwsl_err("can't open auth file: %s\n", filename);
		return 0;
	}

	while (1) {
		if (pos == n) {
			n = (int)read(fd, buf, sizeof(buf));
			if (n <= 0) {
				if (match == stringlen)
					hit = 1;
				break;
			}
			pos = 0;
		}

		if (match == stringlen) {
			if (buf[pos] == '\r' || buf[pos] == '\n') {
				hit = 1;
				break;
			}
			match = 0;
		}

		if (buf[pos] == string[match])
			match++;
		else
			match = 0;

		pos++;
	}

	close(fd);

	return hit;
}